

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprSetHeight(Expr *p)

{
  int iVar1;
  Select *pSelect;
  long lVar2;
  uint uVar3;
  long lVar4;
  int local_c;
  
  local_c = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_c = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_c < iVar1)) {
    local_c = iVar1;
  }
  pSelect = (Select *)(p->x).pList;
  if ((p->flags >> 0xb & 1) == 0) {
    if (pSelect != (Select *)0x0) {
      if (0 < (long)*(int *)&pSelect->pEList) {
        lVar4 = 0;
        do {
          lVar2 = *(long *)((long)pSelect->addrOpenEphm + lVar4 + -0x14);
          if ((lVar2 != 0) && (iVar1 = *(int *)(lVar2 + 0x28), local_c < iVar1)) {
            local_c = iVar1;
          }
          lVar4 = lVar4 + 0x20;
        } while ((long)*(int *)&pSelect->pEList * 0x20 != lVar4);
      }
      if ((long)*(int *)&pSelect->pEList < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 | *(uint *)(*(long *)((long)pSelect->addrOpenEphm + lVar4 + -0x14) + 4);
          lVar4 = lVar4 + 0x20;
        } while ((long)*(int *)&pSelect->pEList * 0x20 != lVar4);
        uVar3 = uVar3 & 0x200104;
      }
      p->flags = uVar3 | p->flags;
    }
  }
  else {
    heightOfSelect(pSelect,&local_c);
  }
  p->nHeight = local_c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}